

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::InstanceOfAction_Execute(EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ScriptContext *scriptContext;
  Var aValue;
  RecyclableObject *pRVar1;
  undefined1 *aValue_00;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == InstanceOfActionTag) {
    aValue = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
    if (aValue != (Var)0x0) {
      if ((ulong)aValue >> 0x30 == 0) {
        pRVar1 = Js::VarTo<Js::RecyclableObject>(aValue);
        if ((((((pRVar1->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          aValue = Js::CrossSite::MarshalVar(scriptContext,pRVar1,false);
        }
      }
      aValue_00 = (undefined1 *)InflateVarInReplay(executeContext,*(TTDVar *)(evt + 2));
      if (aValue_00 != (undefined1 *)0x0) {
        if (aValue_00 < &DAT_1000000000000) {
          pRVar1 = Js::VarTo<Js::RecyclableObject>(aValue_00);
          if ((((((pRVar1->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
              scriptContext.ptr != scriptContext) {
            aValue_00 = (undefined1 *)Js::CrossSite::MarshalVar(scriptContext,pRVar1,false);
          }
        }
        Js::JavascriptOperators::OP_IsInst(aValue,aValue_00,scriptContext,(IsInstInlineCache *)0x0);
        return;
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void InstanceOfAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarArgumentAction, EventKind::InstanceOfActionTag>(evt);
            Js::Var object = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(object, ctx);
            Js::Var constructor = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(constructor, ctx);

            // Result is not needed but trigger computation for any effects
            Js::JavascriptOperators::OP_IsInst(object, constructor, ctx, nullptr);
        }